

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionUtilsBullet.cpp
# Opt level: O3

int chrono::collision::bt_utils::SnapPointToBox(cbtVector3 *hdims,cbtVector3 *loc)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  
  fVar1 = hdims->m_floats[0];
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(ZEXT416((uint)loc->m_floats[0]),auVar11);
  bVar4 = fVar1 < auVar11._0_4_;
  if (bVar4) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar5);
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)loc->m_floats[0]),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    loc->m_floats[0] = (cbtScalar)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * auVar11._0_4_);
  }
  uVar10 = (uint)bVar4;
  fVar1 = hdims->m_floats[1];
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(ZEXT416((uint)loc->m_floats[1]),auVar6);
  if (fVar1 < auVar11._0_4_) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar7);
    uVar10 = uVar10 | 2;
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)loc->m_floats[1]),1);
    bVar4 = (bool)((byte)uVar2 & 1);
    loc->m_floats[1] = (cbtScalar)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * auVar11._0_4_);
  }
  fVar1 = hdims->m_floats[2];
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(ZEXT416((uint)loc->m_floats[2]),auVar8);
  if (fVar1 < auVar11._0_4_) {
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar9);
    uVar10 = uVar10 | 4;
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)loc->m_floats[2]),1);
    bVar4 = (bool)((byte)uVar2 & 1);
    loc->m_floats[2] = (cbtScalar)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * auVar11._0_4_);
  }
  return uVar10;
}

Assistant:

int SnapPointToBox(const cbtVector3& hdims,  // box half-dimensions
                   cbtVector3& loc           // point (in/out)
) {
    int code = 0;

    if (std::abs(loc[0]) > hdims[0]) {
        code |= 1;
        loc[0] = (loc[0] > 0) ? hdims[0] : -hdims[0];
    }
    if (std::abs(loc[1]) > hdims[1]) {
        code |= 2;
        loc[1] = (loc[1] > 0) ? hdims[1] : -hdims[1];
    }
    if (std::abs(loc[2]) > hdims[2]) {
        code |= 4;
        loc[2] = (loc[2] > 0) ? hdims[2] : -hdims[2];
    }

    return code;
}